

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_level_html_actions::module2(module_level_html_actions *this,string *module,int level)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  
  std::operator<<((ostream *)&std::cout," ");
  bVar3 = level - 2U < 0x3ffffffd;
  iVar2 = this->level_ + -1;
  if (iVar2 <= level && bVar3) {
    std::operator<<((ostream *)&std::cout,"<strong>");
  }
  std::operator<<((ostream *)&std::cout,(string *)module);
  if (level < 0x3fffffff) {
    poVar1 = std::operator<<((ostream *)&std::cout,"<sup>");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,level);
    std::operator<<(poVar1,"</sup>");
  }
  if (iVar2 <= level && bVar3) {
    std::operator<<((ostream *)&std::cout,"</strong>");
    return;
  }
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        std::cout << " ";

        bool important = level < unknown_level && level > 1 && level >= level_ - 1;

        if( important )
        {
            std::cout << "<strong>";
        }

        std::cout << module;

        if( level < unknown_level )
        {
            std::cout << "<sup>" << level << "</sup>";
        }

        if( important )
        {
            std::cout << "</strong>";
        }
    }